

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

bool __thiscall
phmap::priv::anon_unknown_0::SubstringLess::operator()(SubstringLess *this,string *a,string *b)

{
  uint uVar1;
  ulong uVar3;
  ulong uVar4;
  difference_type __diff;
  ulong uVar2;
  
  uVar4 = (ulong)this->n;
  uVar3 = a->_M_string_length;
  if (uVar4 <= a->_M_string_length) {
    uVar3 = uVar4;
  }
  if (b->_M_string_length < uVar4) {
    uVar4 = b->_M_string_length;
  }
  uVar2 = uVar4;
  if (uVar3 < uVar4) {
    uVar2 = uVar3;
  }
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    uVar1 = memcmp((a->_M_dataplus)._M_p,(b->_M_dataplus)._M_p,uVar2);
    uVar2 = (ulong)uVar1;
  }
  if ((int)uVar2 == 0) {
    uVar2 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar3 - uVar4)) {
      uVar2 = uVar3 - uVar4;
    }
    if (0x7ffffffe < (long)uVar2) {
      uVar2 = 0;
    }
  }
  return (bool)((byte)(uVar2 >> 0x1f) & 1);
}

Assistant:

bool operator()(const std::string &a, const std::string &b) const {
#if PHMAP_HAVE_STD_STRING_VIEW
            return std::string_view(a).substr(0, n) <
                std::string_view(b).substr(0, n);
#else
            return a.substr(0, n) < b.substr(0, n);
#endif
        }